

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int resolveOrderGroupBy(NameContext *pNC,Select *pSelect,ExprList *pOrderBy,char *zType)

{
  Expr *pExpr;
  ExprList_item *pEVar1;
  int iVar2;
  long lVar3;
  Expr *p;
  long lVar4;
  u16 uVar5;
  uint uVar6;
  ulong uVar7;
  ExprList_item *pEVar8;
  int iCol;
  int local_6c;
  Select *local_68;
  uint local_5c;
  Parse *local_58;
  char *local_50;
  NameContext *local_48;
  Expr *local_40;
  ulong local_38;
  
  if (pOrderBy == (ExprList *)0x0) {
    return 0;
  }
  local_58 = pNC->pParse;
  local_68 = pSelect;
  local_50 = zType;
  local_48 = pNC;
  if (0 < pOrderBy->nExpr) {
    local_5c = pSelect->pEList->nExpr;
    pEVar8 = pOrderBy->a;
    uVar7 = 0;
    local_40 = (Expr *)pOrderBy;
    do {
      pExpr = pEVar8->pExpr;
      local_6c = resolveAsName((Parse *)local_68->pEList,(ExprList *)pExpr,local_40);
      local_38 = uVar7;
      p = pExpr;
      if (local_6c < 1) {
        for (; p != (Expr *)0x0; p = p->pLeft) {
          if ((p->op != '\\') && (p->op != '\x18')) goto LAB_0018739f;
        }
        p = (Expr *)0x0;
LAB_0018739f:
        iVar2 = sqlite3ExprIsInteger(p,&local_6c);
        if (iVar2 != 0) {
          if (local_6c - 0x10000U < 0xffff0001) {
            sqlite3ErrorMsg(local_58,"%r %s BY term out of range - should be between 1 and %d",
                            (ulong)((int)uVar7 + 1),local_50,(ulong)local_5c);
            return 1;
          }
          goto LAB_001873c1;
        }
        pEVar8->iOrderByCol = 0;
        iVar2 = sqlite3ResolveExprNames(local_48,pExpr);
        if (iVar2 != 0) {
          return 1;
        }
        lVar4 = (long)local_68->pEList->nExpr;
        if (0 < lVar4) {
          pEVar1 = local_68->pEList->a;
          uVar5 = 1;
          lVar3 = 0;
          do {
            iVar2 = sqlite3ExprCompare(pExpr,*(Expr **)((long)&pEVar1->pExpr + lVar3));
            if (iVar2 == 0) {
              pEVar8->iOrderByCol = uVar5;
            }
            uVar5 = uVar5 + 1;
            lVar3 = lVar3 + 0x20;
          } while (lVar4 * 0x20 != lVar3);
        }
      }
      else {
LAB_001873c1:
        pEVar8->iOrderByCol = (u16)local_6c;
      }
      uVar6 = (int)local_38 + 1;
      uVar7 = (ulong)uVar6;
      pEVar8 = pEVar8 + 1;
      iVar2._0_1_ = local_40->op;
      iVar2._1_1_ = local_40->affinity;
      iVar2._2_2_ = local_40->flags;
      pOrderBy = (ExprList *)local_40;
    } while ((int)uVar6 < iVar2);
  }
  iVar2 = sqlite3ResolveOrderGroupBy(local_58,local_68,pOrderBy,local_50);
  return iVar2;
}

Assistant:

static int resolveOrderGroupBy(
  NameContext *pNC,     /* The name context of the SELECT statement */
  Select *pSelect,      /* The SELECT statement holding pOrderBy */
  ExprList *pOrderBy,   /* An ORDER BY or GROUP BY clause to resolve */
  const char *zType     /* Either "ORDER" or "GROUP", as appropriate */
){
  int i, j;                      /* Loop counters */
  int iCol;                      /* Column number */
  struct ExprList_item *pItem;   /* A term of the ORDER BY clause */
  Parse *pParse;                 /* Parsing context */
  int nResult;                   /* Number of terms in the result set */

  if( pOrderBy==0 ) return 0;
  nResult = pSelect->pEList->nExpr;
  pParse = pNC->pParse;
  for(i=0, pItem=pOrderBy->a; i<pOrderBy->nExpr; i++, pItem++){
    Expr *pE = pItem->pExpr;
    iCol = resolveAsName(pParse, pSelect->pEList, pE);
    if( iCol>0 ){
      /* If an AS-name match is found, mark this ORDER BY column as being
      ** a copy of the iCol-th result-set column.  The subsequent call to
      ** sqlite3ResolveOrderGroupBy() will convert the expression to a
      ** copy of the iCol-th result-set expression. */
      pItem->iOrderByCol = (u16)iCol;
      continue;
    }
    if( sqlite3ExprIsInteger(sqlite3ExprSkipCollate(pE), &iCol) ){
      /* The ORDER BY term is an integer constant.  Again, set the column
      ** number so that sqlite3ResolveOrderGroupBy() will convert the
      ** order-by term to a copy of the result-set expression */
      if( iCol<1 || iCol>0xffff ){
        resolveOutOfRangeError(pParse, zType, i+1, nResult);
        return 1;
      }
      pItem->iOrderByCol = (u16)iCol;
      continue;
    }

    /* Otherwise, treat the ORDER BY term as an ordinary expression */
    pItem->iOrderByCol = 0;
    if( sqlite3ResolveExprNames(pNC, pE) ){
      return 1;
    }
    for(j=0; j<pSelect->pEList->nExpr; j++){
      if( sqlite3ExprCompare(pE, pSelect->pEList->a[j].pExpr)==0 ){
        pItem->iOrderByCol = j+1;
      }
    }
  }
  return sqlite3ResolveOrderGroupBy(pParse, pSelect, pOrderBy, zType);
}